

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_callerror(lua_State *L,TValue *o)

{
  char *pcVar1;
  char *name;
  char *local_18;
  
  local_18 = (char *)0x0;
  pcVar1 = funcnamefromcall(L,L->ci,&local_18);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = varinfo(L,o);
  }
  else {
    pcVar1 = luaO_pushfstring(L," (%s \'%s\')",pcVar1,local_18);
  }
  typeerror(L,o,"call",pcVar1);
}

Assistant:

l_noret luaG_callerror (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = funcnamefromcall(L, ci, &name);
  const char *extra = kind ? formatvarinfo(L, kind, name) : varinfo(L, o);
  typeerror(L, o, "call", extra);
}